

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O0

void Configtable_clear(_func_int_config_ptr *f)

{
  code *in_RDI;
  int i;
  int local_c;
  
  if ((x4a != (s_x4 *)0x0) && (x4a->count != 0)) {
    if (in_RDI != (code *)0x0) {
      for (local_c = 0; local_c < x4a->count; local_c = local_c + 1) {
        (*in_RDI)(x4a->tbl[local_c].data);
      }
    }
    for (local_c = 0; local_c < x4a->size; local_c = local_c + 1) {
      x4a->ht[local_c] = (s_x4node *)0x0;
    }
    x4a->count = 0;
  }
  return;
}

Assistant:

void Configtable_clear(int(*f)(struct config *))
{
  int i;
  if( x4a==0 || x4a->count==0 ) return;
  if( f ) for(i=0; i<x4a->count; i++) (*f)(x4a->tbl[i].data);
  for(i=0; i<x4a->size; i++) x4a->ht[i] = 0;
  x4a->count = 0;
  return;
}